

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inputs.hpp
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
helics::Input::getValueRef<std::__cxx11::string>(Input *this)

{
  bool bVar1;
  undefined1 uVar2;
  DataType DVar3;
  char *pcVar4;
  string *psVar5;
  int __c;
  char *in_RDI;
  helics *this_00;
  defV *in_stack_00000010;
  DataType in_stack_0000001c;
  data_view *in_stack_00000020;
  defV val_1;
  defV val;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> out;
  data_view *in_stack_000000d0;
  data_view dv;
  Input *in_stack_00000240;
  defV *in_stack_fffffffffffffef8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 uVar6;
  undefined4 in_stack_ffffffffffffff0c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff10;
  undefined7 in_stack_ffffffffffffff18;
  undefined1 in_stack_ffffffffffffff1f;
  data_view *in_stack_ffffffffffffff20;
  data_view *in_stack_ffffffffffffff28;
  Input *in_stack_ffffffffffffff30;
  data_view local_c0;
  double local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58 [2];
  string *in_stack_ffffffffffffffe8;
  defV *in_stack_fffffffffffffff0;
  
  pcVar4 = in_RDI;
  checkAndGetFedUpdate((Input *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  bVar1 = data_view::empty((data_view *)0x370456);
  if (bVar1) {
    this_00 = (helics *)(in_RDI + 0x70);
    pcVar4 = CLI::std::
             variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
             ::index((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                      *)this_00,pcVar4,__c);
    uVar6 = *(undefined4 *)(in_RDI + 0x54);
    DVar3 = helicsType<std::__cxx11::string>(this_00);
    bVar1 = checkForNeededCoreRetrieval
                      (CONCAT44(DVar3,uVar6),(DataType)((ulong)pcVar4 >> 0x20),(DataType)pcVar4);
    if (bVar1) {
      forceCoreDataUpdate(in_stack_ffffffffffffff30);
    }
  }
  else {
    if (*(int *)(in_RDI + 0x54) == -1) {
      loadSourceInformation(in_stack_00000240);
    }
    if ((in_RDI[0x58] & 1U) == 0) {
      helics::valueExtract(in_stack_00000020,in_stack_0000001c,in_stack_00000010);
    }
    else {
      std::__cxx11::string::string(in_stack_ffffffffffffff10);
      if (*(int *)(in_RDI + 0x54) == 1) {
        local_90 = doubleExtractAndConvert
                             (in_stack_ffffffffffffff20,
                              (shared_ptr<units::precise_unit> *)
                              CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18),
                              (shared_ptr<units::precise_unit> *)in_stack_ffffffffffffff10);
        std::
        variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
        ::variant<double,void,void,double,void>
                  ((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                    *)in_stack_ffffffffffffff00,(double *)in_stack_fffffffffffffef8);
        helics::valueExtract(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
        CLI::std::
        variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
        ::~variant((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                    *)0x37052a);
      }
      else if (*(int *)(in_RDI + 0x54) == 2) {
        in_stack_ffffffffffffff20 = &local_c0;
        CLI::std::
        variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
        ::variant((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                   *)0x370588);
        integerExtractAndConvert
                  ((defV *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                   (shared_ptr<units::precise_unit> *)in_stack_ffffffffffffff20,
                   (shared_ptr<units::precise_unit> *)
                   CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
        helics::valueExtract(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
        CLI::std::
        variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
        ::~variant((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                    *)0x3705d0);
      }
      else {
        helics::valueExtract
                  (in_stack_000000d0,out.field_2._12_4_,(string *)out.field_2._M_allocated_capacity)
        ;
      }
      uVar2 = changeDetected((defV *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                             in_stack_ffffffffffffff00,(double)in_stack_fffffffffffffef8);
      if ((bool)uVar2) {
        make_valid<std::__cxx11::string>(local_58);
        std::
        variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
        ::operator=((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                     *)in_stack_ffffffffffffff20,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    CONCAT17(uVar2,in_stack_ffffffffffffff18));
      }
      std::__cxx11::string::~string(in_stack_ffffffffffffff00);
    }
  }
  psVar5 = getValueRefImpl<std::__cxx11::string>(in_stack_fffffffffffffef8);
  data_view::~data_view((data_view *)0x370726);
  return psVar5;
}

Assistant:

const X& Input::getValueRef()
{
    static_assert(std::is_same<typeCategory<X>, std::integral_constant<int, primaryType>>::value,
                  "calling getValue By ref must be with a primary type");
    auto dv = checkAndGetFedUpdate();
    if (!dv.empty()) {
        if (injectionType == DataType::HELICS_UNKNOWN) {
            loadSourceInformation();
        }

        if (changeDetectionEnabled) {
            X out;
            if (injectionType == helics::DataType::HELICS_DOUBLE) {
                defV val = doubleExtractAndConvert(dv, inputUnits, outputUnits);
                valueExtract(val, out);
            } else if (injectionType == helics::DataType::HELICS_INT) {
                defV val;
                integerExtractAndConvert(val, dv, inputUnits, outputUnits);
                valueExtract(val, out);
            } else {
                valueExtract(dv, injectionType, out);
            }
            if (changeDetected(lastValue, out, delta)) {
                lastValue = make_valid(std::move(out));
            }
        } else {
            valueExtract(dv, injectionType, lastValue);
        }
    } else {
        if (checkForNeededCoreRetrieval(lastValue.index(),
                                        injectionType,
                                        helicsType<remove_cv_ref<X>>())) {
            forceCoreDataUpdate();
        }
    }

    return getValueRefImpl<remove_cv_ref<X>>(lastValue);
}